

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page_element *ptr;
  nk_page *pnVar1;
  uint uVar2;
  
  ptr = ctx->freelist;
  if (ptr != (nk_page_element *)0x0) {
    ctx->freelist = ptr->next;
    goto LAB_0013ffc4;
  }
  if (ctx->use_pool == 0) {
    ptr = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x200,8);
    if (ptr == (nk_page_element *)0x0) {
      __assert_fail("elem",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3bc3,"struct nk_page_element *nk_create_page_element(struct nk_context *)");
    }
    goto LAB_0013ffc4;
  }
  pnVar1 = (ctx->pool).pages;
  if (pnVar1 == (nk_page *)0x0) {
    if ((ctx->pool).type == NK_BUFFER_FIXED) {
      __assert_fail("pool->pages",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3b99,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
    }
LAB_0013ff83:
    uVar2 = 0;
    pnVar1 = (nk_page *)(*(ctx->pool).alloc.alloc)((ctx->pool).alloc.userdata,(void *)0x0,0x2110);
    pnVar1->next = (ctx->pool).pages;
    (ctx->pool).pages = pnVar1;
    pnVar1->size = 0;
  }
  else {
    uVar2 = pnVar1->size;
    if ((ctx->pool).capacity <= uVar2) {
      if ((ctx->pool).type == NK_BUFFER_FIXED) {
        __assert_fail("pool->pages->size < pool->capacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3b9b,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
      }
      goto LAB_0013ff83;
    }
  }
  pnVar1->size = uVar2 + 1;
  ptr = pnVar1->win + uVar2;
LAB_0013ffc4:
  nk_zero(ptr,0x200);
  ptr->next = (nk_page_element *)0x0;
  ptr->prev = (nk_page_element *)0x0;
  return ptr;
}

Assistant:

NK_LIB struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from back of fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}